

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

FrameDisplay *
Js::JavascriptOperators::OP_LdFrameDisplay(void *argHead,void *argEnv,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *pTVar2;
  uint16 uVar3;
  Recycler *alloc;
  FrameDisplay *this;
  void *item;
  uint uVar4;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  data._32_8_ = argHead;
  uVar3 = UInt16Math::Add(*(uint16 *)((long)argEnv + 2),1);
  data.typeinfo = (type_info *)(ulong)((uint)uVar3 * 8);
  local_68 = (undefined1  [8])&FrameDisplay::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_4d342ea;
  data.filename._0_4_ = 0x1bb4;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
  this = (FrameDisplay *)new<Memory::Recycler>(8,alloc,0x37ff80,0);
  this->tag = true;
  this->strictMode = false;
  this->length = uVar3;
  this->unused = 0;
  uVar4 = 0;
  while (uVar4 = uVar4 & 0xffff, (int)uVar4 < (int)(uVar3 - 1)) {
    item = FrameDisplay::GetItem((FrameDisplay *)argEnv,uVar4);
    uVar4 = uVar4 + 1;
    FrameDisplay::SetItem(this,uVar4,item);
  }
  FrameDisplay::SetItem(this,0,(void *)data._32_8_);
  pTVar2->noJsReentrancy = bVar1;
  return this;
}

Assistant:

FrameDisplay* JavascriptOperators::OP_LdFrameDisplay(void *argHead, void *argEnv, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrObj_LdFrameDisplay, reentrancylock, scriptContext->GetThreadContext());
        // Build a display of nested frame objects.
        // argHead is the current scope; argEnv is either the lone trailing scope or an array of scopes
        // which we append to the new display.

        // Note that there are cases in which a function with no local frame must construct a display to pass
        // to the function(s) nested within it. In such a case, argHead will be a null object, and it's not
        // strictly necessary to include it. But such cases are rare and not perf critical, so it's not
        // worth the extra complexity to notify the nested functions that they can "skip" this slot in the
        // frame display when they're loading scopes nested outside it.

        FrameDisplay *pDisplay = nullptr;
        FrameDisplay *envDisplay = (FrameDisplay*)argEnv;
        uint16 length = UInt16Math::Add(envDisplay->GetLength(), 1);

        pDisplay = RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(void*), FrameDisplay, length);
        for (uint16 j = 0; j < length - 1; j++)
        {
            pDisplay->SetItem(j + 1, envDisplay->GetItem(j));
        }

        pDisplay->SetItem(0, argHead);

        return pDisplay;
        JIT_HELPER_END(ScrObj_LdFrameDisplay);
    }